

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::parseContentStream_internal
          (QPDFObjectHandle *this,string *description,ParserCallbacks *callbacks)

{
  Pl_Buffer *this_00;
  element_type *this_01;
  size_t sVar1;
  QPDF *context;
  TerminateParsing *anon_var_0;
  undefined1 local_98 [8];
  shared_ptr<Buffer> stream_data;
  undefined1 local_78 [8];
  string all_description;
  Pl_Buffer buf;
  ParserCallbacks *callbacks_local;
  string *description_local;
  QPDFObjectHandle *this_local;
  
  this_00 = (Pl_Buffer *)((long)&all_description.field_2 + 8);
  Pl_Buffer::Pl_Buffer(this_00,"concatenated stream data buffer",(Pipeline *)0x0);
  std::__cxx11::string::string((string *)local_78);
  pipeContentStreams(this,(Pipeline *)this_00,description,(string *)local_78);
  Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)local_98);
  this_01 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_98);
  sVar1 = Buffer::getSize(this_01);
  (*callbacks->_vptr_ParserCallbacks[5])(callbacks,sVar1);
  std::shared_ptr<Buffer>::shared_ptr
            ((shared_ptr<Buffer> *)&anon_var_0,(shared_ptr<Buffer> *)local_98);
  context = getOwningQPDF(this);
  parseContentStream_data((shared_ptr<Buffer> *)&anon_var_0,(string *)local_78,callbacks,context);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&anon_var_0);
  (*callbacks->_vptr_ParserCallbacks[4])();
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_98);
  std::__cxx11::string::~string((string *)local_78);
  Pl_Buffer::~Pl_Buffer((Pl_Buffer *)((long)&all_description.field_2 + 8));
  return;
}

Assistant:

void
QPDFObjectHandle::parseContentStream_internal(
    std::string const& description, ParserCallbacks* callbacks)
{
    Pl_Buffer buf("concatenated stream data buffer");
    std::string all_description;
    pipeContentStreams(&buf, description, all_description);
    auto stream_data = buf.getBufferSharedPointer();
    callbacks->contentSize(stream_data->getSize());
    try {
        parseContentStream_data(stream_data, all_description, callbacks, getOwningQPDF());
    } catch (TerminateParsing&) {
        return;
    }
    callbacks->handleEOF();
}